

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O3

ssize_t asl::Xdl::read(int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  longlong t;
  ulong uVar2;
  ssize_t sVar3;
  ulong __nbytes_00;
  int iVar4;
  uint uVar5;
  undefined4 in_register_0000003c;
  XdlParser *this;
  byte bom [3];
  TextFile tfile;
  XdlParser parser;
  char local_cb;
  char local_ca;
  char local_c9;
  Array<char> local_c8;
  File local_c0;
  XdlParser local_78;
  
  this = (XdlParser *)CONCAT44(in_register_0000003c,__fd);
  XdlParser::XdlParser(&local_78);
  TextFile::TextFile((TextFile *)&local_c0,(String *)__buf,READ);
  if (local_c0._file != (FILE *)0x0) {
    uVar2 = File::size(&local_c0);
    if (0 < (long)uVar2) {
      __nbytes_00 = 100000;
      if (uVar2 < 100000) {
        __nbytes_00 = uVar2;
      }
      uVar5 = 0x3ffe;
      if ((uint)__nbytes_00 < 0x3ffe) {
        uVar5 = (uint)__nbytes_00;
      }
      Array<char>::alloc(&local_c8,uVar5 + 1);
      sVar3 = File::read(&local_c0,(int)&local_cb,(void *)0x3,__nbytes_00);
      if (((int)sVar3 == 3) && (((local_cb != -0x11 || (local_ca != -0x45)) || (local_c9 != -0x41)))
         ) {
        File::seek(&local_c0,0,START);
      }
      iVar4 = *(int *)(local_c8._a + -0x10);
      do {
        sVar3 = File::read(&local_c0,(int)local_c8._a,(void *)(ulong)(iVar4 - 1),__nbytes_00);
        __nbytes_00 = (ulong)(int)sVar3;
        local_c8._a[__nbytes_00] = '\0';
        XdlParser::parse(&local_78,local_c8._a);
        iVar4 = *(int *)(local_c8._a + -0x10);
      } while (iVar4 + -1 <= (int)sVar3);
      XdlParser::parse(&local_78," ");
      XdlParser::value(this);
      LOCK();
      piVar1 = (int *)(local_c8._a + -8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free(local_c8._a + -0x10);
      }
      goto LAB_0012a1f0;
    }
  }
  *(undefined4 *)&this->_vptr_XdlParser = 0;
  this->_state = '\0';
  this->_prevState = '\0';
  *(undefined6 *)&this->field_0xa = 0;
LAB_0012a1f0:
  File::~File(&local_c0);
  XdlParser::~XdlParser(&local_78);
  return (ssize_t)this;
}

Assistant:

Var Xdl::read(const String& file)
{
	XdlParser parser;
	TextFile tfile(file, File::READ);
	if (!tfile)
		return Var();
	int size = int(clamp(tfile.size(), 0ll, 100000ll));
	if (size == 0)
		return Var();
	Array<char> buffer(min(16382, size) + 1);
	byte bom[3];
	if(tfile.read(bom, 3) == 3 && !(bom[0] == 0xef && bom[1] == 0xbb && bom[2] == 0xbf))
		tfile.seek(0);
	while (1)
	{
		int n = tfile.read(buffer.data(), buffer.length() - 1);
		buffer[n] = '\0';
		parser.parse(buffer.data());
		if (n < buffer.length() - 1)
			break;
	}
	parser.parse(" ");
	return parser.value();
}